

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzer::SynchronizeToReset(AsyncRgbLedAnalyzer *this)

{
  int iVar1;
  long lVar2;
  pointer this_00;
  double dVar3;
  undefined1 auVar4 [16];
  TimingTolerance local_40;
  double local_28;
  double lowTimeSec;
  U64 highTransition;
  U64 lowTransition;
  AsyncRgbLedAnalyzer *this_local;
  
  lowTransition = (U64)this;
  iVar1 = AnalyzerChannelData::GetBitState();
  if (iVar1 == 1) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  while( true ) {
    highTransition = AnalyzerChannelData::GetSampleNumber();
    lowTimeSec = (double)AnalyzerChannelData::GetSampleOfNextEdge();
    lVar2 = (long)lowTimeSec - highTransition;
    auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = 0x45300000;
    dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / this->mSampleRateHz;
    local_28 = dVar3;
    this_00 = std::
              unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
              ::operator->(&this->mSettings);
    AsyncRgbLedAnalyzerSettings::ResetTiming(&local_40,this_00);
    if (local_40.mMinimumSec < dVar3) break;
    AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
  return;
}

Assistant:

void AsyncRgbLedAnalyzer::SynchronizeToReset()
{
    if( mChannelData->GetBitState() == BIT_HIGH )
    {
        mChannelData->AdvanceToNextEdge();
    }

    for( ;; )
    {
        const U64 lowTransition = mChannelData->GetSampleNumber();
        const U64 highTransition = mChannelData->GetSampleOfNextEdge();
        double lowTimeSec = ( highTransition - lowTransition ) / mSampleRateHz;

        if( lowTimeSec > mSettings->ResetTiming().mMinimumSec )
        {
            // it's a reset, we are done
            // advance to the end of the reset, ready for the first
            // ReadRGB / ReadBit
            mChannelData->AdvanceToAbsPosition( highTransition );
            return;
        }

        // advance past the rising edge, to the next falling edge,
        // which is our next candidate for the beginning of a RESET
        mChannelData->AdvanceToAbsPosition( highTransition );
        mChannelData->AdvanceToNextEdge();
    }
}